

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O1

void gc(Vm *vm)

{
  CallFrame *pCVar1;
  CrispyValue *pCVar2;
  bool bVar3;
  uint uVar4;
  size_t sVar5;
  ulong uVar6;
  Object *object;
  anon_union_8_3_4e733eb7_for_CrispyValue_1 *paVar7;
  long lVar8;
  ulong uVar9;
  Object **ppOVar10;
  
  uVar4 = vm->frame_count - 1;
  if (-1 < (int)uVar4) {
    uVar9 = (ulong)uVar4;
    do {
      pCVar1 = (vm->frames).frame_pointers[uVar9];
      if ((pCVar1->variables).count != 0) {
        lVar8 = 8;
        uVar6 = 0;
        do {
          pCVar2 = (pCVar1->variables).values;
          if (*(int *)((long)pCVar2 + lVar8 + -8) == 2) {
            mark(*(Object **)((long)&pCVar2->type + lVar8));
          }
          uVar6 = uVar6 + 1;
          lVar8 = lVar8 + 0x10;
        } while (uVar6 < (pCVar1->variables).count);
      }
      if ((pCVar1->constants).count != 0) {
        lVar8 = 8;
        uVar6 = 0;
        do {
          pCVar2 = (pCVar1->constants).values;
          if (*(int *)((long)pCVar2 + lVar8 + -8) == 2) {
            mark(*(Object **)((long)&pCVar2->type + lVar8));
          }
          uVar6 = uVar6 + 1;
          lVar8 = lVar8 + 0x10;
        } while (uVar6 < (pCVar1->constants).count);
      }
      if ((Vm *)vm->sp != vm && -1 < (long)vm->sp - (long)vm) {
        lVar8 = 0;
        paVar7 = &vm->stack[0].field_1;
        do {
          if (((CrispyValue *)(paVar7 + -1))->type == OBJECT) {
            mark(paVar7->o_value);
          }
          lVar8 = lVar8 + 1;
          paVar7 = paVar7 + 2;
        } while (lVar8 < (long)vm->sp - (long)vm >> 4);
      }
      bVar3 = 0 < (long)uVar9;
      uVar9 = uVar9 - 1;
    } while (bVar3);
  }
  object = vm->first_object;
  if (object != (Object *)0x0) {
    ppOVar10 = &vm->first_object;
    do {
      if (object->marked == '\0') {
        *ppOVar10 = object->next;
        sVar5 = free_object(object);
        vm->allocated_mem = vm->allocated_mem - sVar5;
      }
      else {
        object->marked = '\0';
        ppOVar10 = &object->next;
      }
      object = *ppOVar10;
    } while (object != (Object *)0x0);
  }
  vm->max_alloc_mem = vm->allocated_mem * 2;
  return;
}

Assistant:

void gc(Vm *vm) {
#if DEBUG_TRACE_GC
    size_t mem_before = vm->allocated_mem;
#endif

#if DISABLE_GC
    return;
#endif

    mark_all(vm);
    sweep(vm);

    vm->max_alloc_mem = vm->allocated_mem * 2;

#if DEBUG_TRACE_GC
    printf("Collected %ld bytes, %ld remaining.\n", mem_before - vm->allocated_mem, vm->allocated_mem);
#endif
}